

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::compute::anon_unknown_0::CopyImageToSSBOTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CopyImageToSSBOTestInstance *this)

{
  int iVar1;
  void *pvVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  Handle<(vk::HandleType)24> obj;
  Allocation *pAVar3;
  undefined8 obj_00;
  int i;
  deUint32 queueFamilyIndex;
  deUint32 dVar4;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  long lVar5;
  DescriptorSetLayoutBuilder *pDVar6;
  DescriptorPoolBuilder *pDVar7;
  DescriptorSetUpdateBuilder *pDVar8;
  const_iterator cVar9;
  ostream *poVar10;
  int i_1;
  VkDeviceSize bufferSize;
  uint uVar11;
  uint uVar12;
  VkExtent3D extent;
  Move<vk::Handle<(vk::HandleType)24>_> local_598;
  CopyImageToSSBOTestInstance *local_570;
  IVec2 workSize;
  VkImageMemoryBarrier imagePostCopyBarrier;
  long local_4f8;
  long *plStack_4f0;
  pointer local_4e8;
  VkAllocationCallbacks *pVStack_4e0;
  VkQueue local_4d0;
  Buffer stagingBuffer;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_490;
  VkDescriptorSetLayout local_478;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_470;
  Buffer outputBuffer;
  Image image;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_3a0;
  VkPipeline local_388;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_380;
  VkShaderModule local_368;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_360;
  VkDescriptorPool local_348;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_340;
  VkImageView local_328;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_320;
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkDescriptorImageInfo imageDescriptorInfo;
  Random rnd;
  pointer local_2c8;
  VkDescriptorPool VStack_2c0;
  VkImage local_2b0;
  pointer local_2a8;
  pointer local_298;
  ios_base local_268 [272];
  Move<vk::VkCommandBuffer_s_*> local_158;
  VkBufferMemoryBarrier computeFinishBarrier;
  VkBufferMemoryBarrier stagingBufferPostHostWriteBarrier;
  VkBufferImageCopy copyParams;
  VkImageCreateInfo imageParams;
  
  vk = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device = Context::getDevice((this->super_TestInstance).m_context);
  local_4d0 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.format = VK_FORMAT_R32_UINT;
  imageParams.extent._0_8_ = *(undefined8 *)(this->m_imageSize).m_data;
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 10;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_570 = this;
  Image::Image(&image,vk,device,allocator,&imageParams,(MemoryRequirement)0x0);
  subresourceRange.levelCount = 1;
  subresourceRange.baseArrayLayer = 0;
  subresourceRange.aspectMask = 1;
  subresourceRange.baseMipLevel = 0;
  subresourceRange.layerCount = 1;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)&rnd,vk,device,
                (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                         m_internal,VK_IMAGE_VIEW_TYPE_2D,VK_FORMAT_R32_UINT,subresourceRange);
  DStack_320.m_device = (VkDevice)local_2c8;
  DStack_320.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_328.m_internal._0_4_ = rnd.m_rnd.x;
  local_328.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_320.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  lVar5 = 0;
  uVar12 = 1;
  do {
    uVar11 = uVar12;
    iVar1 = (local_570->m_imageSize).m_data[lVar5];
    uVar12 = iVar1 * uVar11;
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  bufferSize = (ulong)uVar12 << 2;
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,1);
  compute::Buffer::Buffer
            (&stagingBuffer,vk,device,allocator,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  deRandom_init(&rnd.m_rnd,0xab2c7);
  pAVar3 = stagingBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (uVar12 != 0) {
    pvVar2 = (stagingBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_hostPtr;
    lVar5 = 0;
    do {
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      *(deUint32 *)((long)pvVar2 + lVar5 * 4) = dVar4;
      lVar5 = lVar5 + 1;
    } while (iVar1 * uVar11 != (int)lVar5);
  }
  ::vk::flushMappedMemoryRange
            (vk,device,(VkDeviceMemory)(pAVar3->m_memory).m_internal,pAVar3->m_offset,bufferSize);
  makeBufferCreateInfo((VkBufferCreateInfo *)&rnd,bufferSize,0x20);
  compute::Buffer::Buffer
            (&outputBuffer,vk,device,allocator,(VkBufferCreateInfo *)&rnd,(MemoryRequirement)0x1);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder((DescriptorSetLayoutBuilder *)&rnd);
  pDVar6 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     ((DescriptorSetLayoutBuilder *)&rnd,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1,0x20,
                      (VkSampler *)0x0);
  pDVar6 = ::vk::DescriptorSetLayoutBuilder::addBinding
                     (pDVar6,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1,0x20,(VkSampler *)0x0);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&imagePostCopyBarrier,pDVar6,vk,device,0);
  DStack_470.m_device = (VkDevice)imagePostCopyBarrier._16_8_;
  DStack_470.m_allocator = (VkAllocationCallbacks *)imagePostCopyBarrier._24_8_;
  local_478.m_internal = imagePostCopyBarrier._0_8_;
  DStack_470.m_deviceIface = (DeviceInterface *)imagePostCopyBarrier.pNext;
  imagePostCopyBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imagePostCopyBarrier._4_4_ = 0;
  imagePostCopyBarrier.pNext = (void *)0x0;
  imagePostCopyBarrier.srcAccessMask = 0;
  imagePostCopyBarrier.dstAccessMask = 0;
  imagePostCopyBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imagePostCopyBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  if (local_2a8 != (pointer)0x0) {
    operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
  }
  if ((VkAllocationCallbacks *)VStack_2c0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_2c0.m_internal,local_2b0.m_internal - VStack_2c0.m_internal);
  }
  if (rnd.m_rnd._0_8_ != 0) {
    operator_delete((void *)rnd.m_rnd._0_8_,(long)local_2c8 - rnd.m_rnd._0_8_);
  }
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&imagePostCopyBarrier)
  ;
  pDVar7 = ::vk::DescriptorPoolBuilder::addType
                     ((DescriptorPoolBuilder *)&imagePostCopyBarrier,
                      VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar7 = ::vk::DescriptorPoolBuilder::addType(pDVar7,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&rnd,pDVar7,vk,device,1,1);
  DStack_340.m_device = (VkDevice)local_2c8;
  DStack_340.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_348.m_internal._0_4_ = rnd.m_rnd.x;
  local_348.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_340.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_2c8 = (pointer)0x0;
  VStack_2c0.m_internal = 0;
  if (imagePostCopyBarrier._0_8_ != 0) {
    operator_delete((void *)imagePostCopyBarrier._0_8_,
                    imagePostCopyBarrier._16_8_ - imagePostCopyBarrier._0_8_);
  }
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&rnd,vk,device,local_348,local_478);
  local_4e8 = local_2c8;
  pVStack_4e0 = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_4f8._0_4_ = rnd.m_rnd.x;
  local_4f8._4_4_ = rnd.m_rnd.y;
  plStack_4f0 = (long *)rnd.m_rnd._8_8_;
  bufferDescriptorInfo.buffer.m_internal =
       outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  bufferDescriptorInfo.offset = 0;
  bufferDescriptorInfo.range = bufferSize;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder((DescriptorSetUpdateBuilder *)&rnd);
  pDVar8 = (DescriptorSetUpdateBuilder *)
           ::vk::DescriptorSetUpdateBuilder::write
                     ((DescriptorSetUpdateBuilder *)&rnd,(int)local_4f8,(void *)0x0,0);
  pDVar8 = (DescriptorSetUpdateBuilder *)
           ::vk::DescriptorSetUpdateBuilder::write(pDVar8,(int)local_4f8,&DAT_00000001,0);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar8,vk,device);
  if (local_2a8 != (pointer)0x0) {
    operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
  }
  if ((VkAllocationCallbacks *)VStack_2c0.m_internal != (VkAllocationCallbacks *)0x0) {
    operator_delete((void *)VStack_2c0.m_internal,local_2b0.m_internal - VStack_2c0.m_internal);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&rnd);
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((local_570->super_TestInstance).m_context)->m_progCollection;
  imagePostCopyBarrier._0_8_ = &imagePostCopyBarrier.srcAccessMask;
  std::__cxx11::string::_M_construct<char_const*>((string *)&imagePostCopyBarrier,"comp","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(this_00,(key_type *)&imagePostCopyBarrier);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&rnd,vk,device,
             *(ProgramBinary **)(cVar9._M_node + 2),0);
  DStack_360.m_device = (VkDevice)local_2c8;
  DStack_360.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_368.m_internal._0_4_ = rnd.m_rnd.x;
  local_368.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_360.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  rnd.m_rnd.x = 0;
  rnd.m_rnd.y = 0;
  rnd.m_rnd.z = 0;
  rnd.m_rnd.w = 0;
  local_2c8 = (pointer)0x0;
  VStack_2c0.m_internal = 0;
  if ((VkAccessFlags *)imagePostCopyBarrier._0_8_ != &imagePostCopyBarrier.srcAccessMask) {
    operator_delete((void *)imagePostCopyBarrier._0_8_,imagePostCopyBarrier._16_8_ + 1);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&rnd,vk,device,local_478);
  obj_00 = rnd.m_rnd._0_8_;
  DStack_490.m_device = (VkDevice)local_2c8;
  DStack_490.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  DStack_490.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&rnd,vk,device,
                      (VkPipelineLayout)rnd.m_rnd._0_8_,local_368);
  DStack_380.m_device = (VkDevice)local_2c8;
  DStack_380.m_allocator = (VkAllocationCallbacks *)VStack_2c0.m_internal;
  local_388.m_internal._0_4_ = rnd.m_rnd.x;
  local_388.m_internal._4_4_ = rnd.m_rnd.y;
  DStack_380.m_deviceIface = (DeviceInterface *)rnd.m_rnd._8_8_;
  makeBufferMemoryBarrier
            (&stagingBufferPostHostWriteBarrier,0x4000,0x800,
             (VkBuffer)
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  subresourceRange_00.levelCount = 1;
  subresourceRange_00.baseArrayLayer = 0;
  subresourceRange_00.aspectMask = 1;
  subresourceRange_00.baseMipLevel = 0;
  subresourceRange_00.layerCount = 1;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)&rnd,0,0x1000,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_00);
  subresourceRange_01.levelCount = 1;
  subresourceRange_01.baseArrayLayer = 0;
  subresourceRange_01.aspectMask = 1;
  subresourceRange_01.baseMipLevel = 0;
  subresourceRange_01.layerCount = 1;
  makeImageMemoryBarrier
            (&imagePostCopyBarrier,0x1000,0x20,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
             VK_IMAGE_LAYOUT_GENERAL,
             (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal,subresourceRange_01);
  dVar4 = 0;
  makeBufferMemoryBarrier
            (&computeFinishBarrier,0x40,0x2000,
             (VkBuffer)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,0,bufferSize);
  extent.depth = 1;
  extent.width = 1;
  extent.height = 0;
  makeBufferImageCopy(&copyParams,*(compute **)(local_570->m_imageSize).m_data,extent,dVar4);
  workSize.m_data[0] = 0;
  workSize.m_data[1] = 0;
  lVar5 = 0;
  do {
    workSize.m_data[lVar5] =
         (local_570->m_imageSize).m_data[lVar5] / (local_570->m_localSize).m_data[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  makeCommandPool(&local_598,vk,device,queueFamilyIndex);
  obj.m_internal = local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
  ;
  DStack_3a0.m_device =
       local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  DStack_3a0.m_allocator =
       local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  DStack_3a0.m_deviceIface =
       local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface;
  ::vk::allocateCommandBuffer
            (&local_158,vk,device,
             (VkCommandPool)
             local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device;
  local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  beginCommandBuffer(vk,local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  (*vk->_vptr_DeviceInterface[0x4c])
            (vk,local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,1,
             local_388.m_internal);
  (*vk->_vptr_DeviceInterface[0x56])
            (vk,local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,1,
             obj_00,0,1,&local_4f8,0,0);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             0x4000,0x1000,0,0,0,1,&stagingBufferPostHostWriteBarrier,1,
             (int)(VkImageMemoryBarrier *)&rnd);
  (*vk->_vptr_DeviceInterface[0x62])
            (vk,local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
             m_internal,
             image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal,7,
             1,(int)&copyParams);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             0x1000,1,0,0,0,0,0,1,(int)&imagePostCopyBarrier);
  (*vk->_vptr_DeviceInterface[0x5d])
            (vk,local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             (ulong)workSize.m_data & 0xffffffff,(ulong)workSize.m_data >> 0x20,1);
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             0x800,0x4000,0,0,0,1,&computeFinishBarrier,0,0);
  endCommandBuffer(vk,(VkCommandBuffer)
                      local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal);
  submitCommandsAndWait
            (vk,device,local_4d0,
             (VkCommandBuffer)
             local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal);
  if ((VkCommandBuffer)
      local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
      (VkCommandBuffer)0x0) {
    local_158.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
         (VkCommandBuffer_s *)
         local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
    (*(local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface)->
      _vptr_DeviceInterface[0x48])
              (local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
               ,local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device,
               local_598.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,1
              );
  }
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_3a0,(VkCommandPool)obj.m_internal);
  }
  if (local_388.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_380,local_388);
  }
  if (obj_00 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_490,(VkPipelineLayout)obj_00);
  }
  if (local_368.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_360,local_368);
  }
  pAVar3 = outputBuffer.m_allocation.
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (vk,device,
             (VkDeviceMemory)
             ((outputBuffer.m_allocation.
               super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_memory).m_internal,
             (outputBuffer.m_allocation.
              super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
             m_offset,bufferSize);
  if (uVar12 != 0) {
    lVar5 = 0;
    do {
      if (*(int *)((long)pAVar3->m_hostPtr + lVar5 * 4) !=
          *(int *)((long)(stagingBuffer.m_allocation.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_hostPtr + lVar5 * 4)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&rnd);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&rnd,"Comparison failed for Output.values[",0x24);
        poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&rnd);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]",1);
        std::__cxx11::stringbuf::str();
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,imagePostCopyBarrier._0_8_,
                   (long)imagePostCopyBarrier.pNext + imagePostCopyBarrier._0_8_);
        if ((VkAccessFlags *)imagePostCopyBarrier._0_8_ != &imagePostCopyBarrier.srcAccessMask) {
          operator_delete((void *)imagePostCopyBarrier._0_8_,imagePostCopyBarrier._16_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&rnd);
        std::ios_base::~ios_base(local_268);
        goto LAB_007316c9;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 * uVar11 != (int)lVar5);
  }
  rnd.m_rnd._0_8_ = &local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&rnd,"Compute succeeded","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,rnd.m_rnd._0_8_,
             rnd.m_rnd._8_8_ + rnd.m_rnd._0_8_);
  if ((pointer *)rnd.m_rnd._0_8_ != &local_2c8) {
    operator_delete((void *)rnd.m_rnd._0_8_,
                    (ulong)((long)&(local_2c8->imageInfos).
                                   super__Vector_base<vk::VkDescriptorImageInfo,_std::allocator<vk::VkDescriptorImageInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + 1));
  }
LAB_007316c9:
  if (local_4f8 != 0) {
    rnd.m_rnd.x = (undefined4)local_4f8;
    rnd.m_rnd.y = local_4f8._4_4_;
    (**(code **)(*plStack_4f0 + 0x1e8))(plStack_4f0,local_4e8,pVStack_4e0,1);
  }
  if (local_348.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_340,local_348);
  }
  if (local_478.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()(&DStack_470,local_478);
  }
  if (outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (outputBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(outputBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    outputBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.ptr = (Allocation *)0x0;
  }
  if (stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal
      != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,
               (VkBuffer)
               stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
               m_internal);
  }
  stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  stagingBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  if (stagingBuffer.m_allocation.
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr !=
      (Allocation *)0x0) {
    (*(stagingBuffer.m_allocation.
       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
      _vptr_Allocation[1])();
    stagingBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
    .m_data.ptr = (Allocation *)0x0;
  }
  if (local_328.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_320,local_328);
  }
  if (image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
               (VkImage)image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                        m_internal);
  }
  image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
  image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  if (image.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
      m_data.ptr != (Allocation *)0x0) {
    (*(image.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
       m_data.ptr)->_vptr_Allocation[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus CopyImageToSSBOTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create an image

	const VkImageCreateInfo imageParams = make2DImageCreateInfo(m_imageSize, VK_IMAGE_USAGE_TRANSFER_DST_BIT | VK_IMAGE_USAGE_STORAGE_BIT);
	const Image image(vk, device, allocator, imageParams, MemoryRequirement::Any);

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView> imageView(makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R32_UINT, subresourceRange));

	// Staging buffer (source data for image)

	const deUint32 imageArea = multiplyComponents(m_imageSize);
	const VkDeviceSize bufferSizeBytes = sizeof(deUint32) * imageArea;

	const Buffer stagingBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_SRC_BIT), MemoryRequirement::HostVisible);

	// Populate the staging buffer with test data
	{
		de::Random rnd(0xab2c7);
		const Allocation& stagingBufferAllocation = stagingBuffer.getAllocation();
		deUint32* bufferPtr = static_cast<deUint32*>(stagingBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < imageArea; ++i)
			*bufferPtr++ = rnd.getUint32();

		flushMappedMemoryRange(vk, device, stagingBufferAllocation.getMemory(), stagingBufferAllocation.getOffset(), bufferSizeBytes);
	}

	// Create a buffer to store shader output

	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	// Set the bindings

	const VkDescriptorImageInfo imageDescriptorInfo = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*outputBuffer, 0ull, bufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &bufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageDescriptorInfo)
		.update(vk, device);

	// Perform the computation
	{
		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
		const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
		const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		const VkBufferMemoryBarrier stagingBufferPostHostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT, *stagingBuffer, 0ull, bufferSizeBytes);

		const VkImageMemoryBarrier imagePreCopyBarrier = makeImageMemoryBarrier(
			0u, VK_ACCESS_TRANSFER_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
			*image, subresourceRange);

		const VkImageMemoryBarrier imagePostCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT,
			VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL,
			*image, subresourceRange);

		const VkBufferMemoryBarrier computeFinishBarrier = makeBufferMemoryBarrier(VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, bufferSizeBytes);

		const VkBufferImageCopy copyParams = makeBufferImageCopy(m_imageSize);
		const tcu::IVec2 workSize = m_imageSize / m_localSize;

		// Prepare the command buffer

		const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
		const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		// Start recording commands

		beginCommandBuffer(vk, *cmdBuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &stagingBufferPostHostWriteBarrier, 1, &imagePreCopyBarrier);
		vk.cmdCopyBufferToImage(*cmdBuffer, *stagingBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, 1u, &copyParams);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imagePostCopyBarrier);

		vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), 1u);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &computeFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

		endCommandBuffer(vk, *cmdBuffer);

		// Wait for completion

		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), bufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32* refBufferPtr = static_cast<deUint32*>(stagingBuffer.getAllocation().getHostPtr());

	for (deUint32 ndx = 0; ndx < imageArea; ++ndx)
	{
		const deUint32 res = *(bufferPtr + ndx);
		const deUint32 ref = *(refBufferPtr + ndx);

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for Output.values[" << ndx << "]";
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}